

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  bool bVar1;
  Slice *in_RCX;
  InternalKey *in_RDX;
  int in_ESI;
  atomic<bool> *in_RDI;
  long in_FS_OFFSET;
  MutexLock l;
  ManualCompaction manual;
  InternalKey end_storage;
  InternalKey begin_storage;
  DBImpl *in_stack_fffffffffffffee8;
  InternalKey *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  bool bVar2;
  ValueType in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 local_80 [4];
  byte local_7c;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x255,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if (6 < in_ESI + 1) {
    __assert_fail("level + 1 < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x256,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffee8);
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffee8);
  ManualCompaction::ManualCompaction((ManualCompaction *)in_stack_fffffffffffffee8);
  local_7c = 0;
  if (in_RDX == (InternalKey *)0x0) {
    local_78 = (undefined1 *)0x0;
  }
  else {
    InternalKey::InternalKey
              (in_RDX,in_RCX,CONCAT44(in_ESI,in_stack_ffffffffffffff28),in_stack_ffffffffffffff14);
    InternalKey::operator=
              ((InternalKey *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,
                                 CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),
               in_stack_fffffffffffffef0);
    InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffee8);
    local_78 = local_28;
  }
  if (in_RCX == (Slice *)0x0) {
    local_70 = (undefined1 *)0x0;
  }
  else {
    InternalKey::InternalKey
              (in_RDX,in_RCX,CONCAT44(in_ESI,in_stack_ffffffffffffff28),in_stack_ffffffffffffff14);
    InternalKey::operator=
              ((InternalKey *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,
                                 CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),
               in_stack_fffffffffffffef0);
    InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffee8);
    local_70 = local_48;
  }
  MutexLock::MutexLock((MutexLock *)in_stack_fffffffffffffee8,(Mutex *)0x188d655);
  while( true ) {
    bVar2 = false;
    if ((local_7c & 1) == 0) {
      bVar1 = std::atomic<bool>::load
                        (in_RDI,(uint)CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc))
      ;
      bVar2 = false;
      if (!bVar1) {
        in_stack_fffffffffffffefe = Status::ok((Status *)in_stack_fffffffffffffee8);
        bVar2 = (bool)in_stack_fffffffffffffefe;
      }
    }
    if (bVar2 == false) break;
    if (*(long *)(in_RDI + 0x220) == 0) {
      *(undefined1 **)(in_RDI + 0x220) = local_80;
      MaybeScheduleCompaction(in_stack_fffffffffffffee8);
    }
    else {
      port::CondVar::Wait((CondVar *)
                          CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffefe,
                                                  CONCAT24(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8))));
    }
  }
  if (*(undefined1 **)(in_RDI + 0x220) == local_80) {
    *(undefined8 *)(in_RDI + 0x220) = 0;
  }
  MutexLock::~MutexLock((MutexLock *)in_stack_fffffffffffffee8);
  ManualCompaction::~ManualCompaction((ManualCompaction *)in_stack_fffffffffffffee8);
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffee8);
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}